

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall Tokenizer::nextPos(Tokenizer *this)

{
  ulong uVar1;
  pointer pbVar2;
  unsigned_long uVar3;
  Error *this_00;
  unsigned_long uVar4;
  bool bVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  allocator<char> local_39;
  string local_38;
  
  uVar1 = (this->_ptr).first;
  pbVar2 = (this->_lines_buffer).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 < (ulong)((long)(this->_lines_buffer).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5)) {
    uVar3 = (this->_ptr).second;
    bVar5 = uVar3 == pbVar2[uVar1]._M_string_length - 1;
    uVar4 = 0;
    if (!bVar5) {
      uVar4 = uVar3 + 1;
    }
    pVar6.first = bVar5 + uVar1;
    pVar6.second = uVar4;
    return pVar6;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"advance after EOF",&local_39);
  Error::Error(this_00,&local_38);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

std::pair<uint64_t, uint64_t> Tokenizer::nextPos() {
	if (_ptr.first >= _lines_buffer.size())
		throw Error("advance after EOF");
	if (_ptr.second == _lines_buffer[_ptr.first].size() - 1)
		return std::make_pair(_ptr.first + 1, 0);
	else
		return std::make_pair(_ptr.first, _ptr.second + 1);
}